

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O0

errr Term_putch(wchar_t x,wchar_t y,wchar_t a,wchar_t c)

{
  errr res;
  wchar_t c_local;
  wchar_t a_local;
  wchar_t y_local;
  wchar_t x_local;
  
  y_local = Term_gotoxy(x,y);
  if ((y_local == L'\0') && (y_local = Term_addch(a,c), y_local == L'\0')) {
    y_local = L'\0';
  }
  return y_local;
}

Assistant:

errr Term_putch(int x, int y, int a, wchar_t c)
{
	errr res;

	/* Move first */
	if ((res = Term_gotoxy(x, y)) != 0) return (res);

	/* Then add the char */
	if ((res = Term_addch(a, c)) != 0) return (res);

	/* Success */
	return (0);
}